

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O3

void background_work_sleep_once(tsdn_t *tsdn,background_thread_info_t *info,uint ind)

{
  _Bool _Var1;
  arena_t *arena;
  background_thread_info_t *pbVar2;
  uint uVar3;
  int iVar4;
  uint64_t uVar5;
  uint64_t ns;
  uint i;
  ulong uVar6;
  nstime_t before_sleep;
  timespec ts;
  nstime_t ts_wakeup;
  nstime_t next_wakeup;
  timeval tv;
  nstime_t local_70;
  background_thread_info_t *local_68;
  timespec local_60;
  nstime_t local_50;
  nstime_t local_48;
  timeval local_40;
  
  uVar3 = duckdb_je_narenas_total_get();
  _Var1 = (info->indefinite_sleep).repr;
  uVar6 = 0xffffffffffffffff;
  local_68 = info;
  if (ind < uVar3) {
    do {
      arena = (arena_t *)duckdb_je_arenas[ind].repr;
      if (arena != (arena_t *)0x0) {
        if ((_Var1 & 1U) == 0) {
          duckdb_je_arena_do_deferred_work(tsdn,arena);
        }
        if ((100000000 < uVar6) &&
           (uVar5 = duckdb_je_pa_shard_time_until_deferred_work(tsdn,&arena->pa_shard),
           uVar5 < uVar6)) {
          uVar6 = uVar5;
        }
      }
      ind = ind + (int)duckdb_je_max_background_threads;
    } while (ind < uVar3);
  }
  pbVar2 = local_68;
  local_68->tot_n_runs = local_68->tot_n_runs + 1;
  local_68->npages_to_purge_new = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  duckdb_je_nstime_init2(&local_70,local_40.tv_sec,local_40.tv_usec * 1000);
  if (uVar6 == 0xffffffffffffffff) {
    (pbVar2->indefinite_sleep).repr = true;
    duckdb_je_nstime_init(&pbVar2->next_wakeup,0xffffffffffffffff);
    pthread_cond_wait((pthread_cond_t *)&pbVar2->cond,
                      (pthread_mutex_t *)((long)&(pbVar2->mtx).field_0 + 0x48));
  }
  else {
    uVar5 = 100000000;
    if (100000000 < uVar6) {
      uVar5 = uVar6;
    }
    duckdb_je_nstime_init_update(&local_48);
    duckdb_je_nstime_iadd(&local_48,uVar5);
    ns = duckdb_je_nstime_ns(&local_48);
    (pbVar2->indefinite_sleep).repr = ns == 0xffffffffffffffff;
    duckdb_je_nstime_init(&pbVar2->next_wakeup,ns);
    duckdb_je_nstime_copy(&local_50,&local_70);
    duckdb_je_nstime_iadd(&local_50,uVar5);
    local_60.tv_sec = duckdb_je_nstime_sec(&local_50);
    local_60.tv_nsec = duckdb_je_nstime_nsec(&local_50);
    pthread_cond_timedwait
              ((pthread_cond_t *)&pbVar2->cond,
               (pthread_mutex_t *)((long)&(pbVar2->mtx).field_0 + 0x48),&local_60);
  }
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  duckdb_je_nstime_init2((nstime_t *)&local_60,local_40.tv_sec,local_40.tv_usec * 1000);
  iVar4 = duckdb_je_nstime_compare((nstime_t *)&local_60,&local_70);
  if (0 < iVar4) {
    duckdb_je_nstime_subtract((nstime_t *)&local_60,&local_70);
    duckdb_je_nstime_add(&pbVar2->tot_sleep_time,(nstime_t *)&local_60);
  }
  return;
}

Assistant:

static inline void
background_work_sleep_once(tsdn_t *tsdn, background_thread_info_t *info,
    unsigned ind) {
	uint64_t ns_until_deferred = BACKGROUND_THREAD_DEFERRED_MAX;
	unsigned narenas = narenas_total_get();
	bool slept_indefinitely = background_thread_indefinite_sleep(info);

	for (unsigned i = ind; i < narenas; i += max_background_threads) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		/*
		 * If thread was woken up from the indefinite sleep, don't
		 * do the work instantly, but rather check when the deferred
		 * work that caused this thread to wake up is scheduled for.
		 */
		if (!slept_indefinitely) {
			arena_do_deferred_work(tsdn, arena);
		}
		if (ns_until_deferred <= BACKGROUND_THREAD_MIN_INTERVAL_NS) {
			/* Min interval will be used. */
			continue;
		}
		uint64_t ns_arena_deferred = pa_shard_time_until_deferred_work(
		    tsdn, &arena->pa_shard);
		if (ns_arena_deferred < ns_until_deferred) {
			ns_until_deferred = ns_arena_deferred;
		}
	}

	uint64_t sleep_ns;
	if (ns_until_deferred == BACKGROUND_THREAD_DEFERRED_MAX) {
		sleep_ns = BACKGROUND_THREAD_INDEFINITE_SLEEP;
	} else {
		sleep_ns =
		    (ns_until_deferred < BACKGROUND_THREAD_MIN_INTERVAL_NS)
		    ? BACKGROUND_THREAD_MIN_INTERVAL_NS
		    : ns_until_deferred;

	}

	background_thread_sleep(tsdn, info, sleep_ns);
}